

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::EnumValBuilder::ValidateImpl<(flatbuffers::BaseType)6,unsigned_short>
          (EnumValBuilder *this,int64_t *ev,int m)

{
  string *msg;
  unsigned_short uVar1;
  int in_ECX;
  undefined4 in_register_00000014;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ulong local_40;
  T dn;
  T up;
  T v;
  long *plStack_20;
  int m_local;
  int64_t *ev_local;
  EnumValBuilder *this_local;
  
  plStack_20 = (long *)CONCAT44(in_register_00000014,m);
  up = *plStack_20;
  v._4_4_ = in_ECX;
  ev_local = ev;
  this_local = this;
  uVar1 = std::numeric_limits<unsigned_short>::max();
  dn = (T)uVar1;
  uVar1 = std::numeric_limits<unsigned_short>::lowest();
  local_40 = (ulong)uVar1;
  if ((up < (long)local_40) || (dn - v._4_4_ < up)) {
    msg = (string *)*ev;
    NumToString<long>(&local_e0,up);
    std::operator+(&local_c0,"enum value does not fit, \"",&local_e0);
    __rhs = "\"";
    if (v._4_4_ != 0) {
      __rhs = " + 1\"";
    }
    std::operator+(&local_a0,&local_c0,__rhs);
    std::operator+(&local_80,&local_a0," out of ");
    anon_unknown_0::TypeToIntervalString<unsigned_short>();
    std::operator+(&local_60,&local_80,&local_110);
    Parser::Error((Parser *)this,msg);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    *plStack_20 = up + v._4_4_;
    anon_unknown_0::NoError();
  }
  return SUB82(this,0);
}

Assistant:

inline FLATBUFFERS_CHECKED_ERROR ValidateImpl(int64_t *ev, int m) {
    typedef typename EnumHelper::EnumValType<E>::type T;  // int64_t or uint64_t
    static_assert(sizeof(T) == sizeof(int64_t), "invalid EnumValType");
    const auto v = static_cast<T>(*ev);
    auto up = static_cast<T>((flatbuffers::numeric_limits<CTYPE>::max)());
    auto dn = static_cast<T>((flatbuffers::numeric_limits<CTYPE>::lowest)());
    if (v < dn || v > (up - m)) {
      return parser.Error("enum value does not fit, \"" + NumToString(v) +
                          (m ? " + 1\"" : "\"") + " out of " +
                          TypeToIntervalString<CTYPE>());
    }
    *ev = static_cast<int64_t>(v + m);  // well-defined since C++20.
    return NoError();
  }